

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.c
# Opt level: O3

void setupScale(Layer *l,int scale)

{
  while( true ) {
    l->scale = scale;
    if (l->p != (Layer *)0x0) {
      setupScale(l->p,l->zoom * scale);
    }
    if (l->p2 == (Layer *)0x0) break;
    scale = scale * l->zoom;
    l = l->p2;
  }
  return;
}

Assistant:

static void setupScale(Layer *l, int scale)
{
    l->scale = scale;
    if (l->p)
        setupScale(l->p, scale * l->zoom);
    if (l->p2)
        setupScale(l->p2, scale * l->zoom);
}